

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(int int_id)

{
  ImVector<unsigned_int> *this;
  ImGuiID local_1c;
  ImGuiWindow *local_18;
  ImGuiWindow *window;
  int int_id_local;
  
  local_18 = GImGui->CurrentWindow;
  this = &local_18->IDStack;
  window._4_4_ = int_id;
  local_1c = ImGuiWindow::GetIDNoKeepAlive(local_18,int_id);
  ImVector<unsigned_int>::push_back(this,&local_1c);
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    window->IDStack.push_back(window->GetIDNoKeepAlive(int_id));
}